

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  HTTPHandler<Client> http_handler;
  LoggingHandler<Client> logging_handler;
  ExceptionHandler<Client> exception_handler;
  Acceptor<Client> acceptor;
  Server<Client> server;
  undefined **local_1c8;
  path local_1c0;
  undefined8 *local_198;
  IHandler<Client> local_190;
  undefined ***local_188;
  undefined8 *local_180;
  undefined **local_178;
  undefined1 *local_170;
  undefined8 *local_168;
  Acceptor<Client> local_160;
  Server<Client> local_140;
  
  Acceptor<Client>::Acceptor(&local_160,0x1ed0);
  local_1c8 = &PTR_handle_0010c978;
  std::filesystem::__cxx11::path::path(&local_1c0,&RESOLVE_PATH_abi_cxx11_);
  local_198 = &std::cerr;
  local_188 = &local_178;
  local_178 = &PTR_handle_0010ca58;
  local_168 = &std::cerr;
  local_140.handler = &local_190;
  local_190._vptr_IHandler = (_func_int **)&PTR_handle_0010ca98;
  local_180 = &std::cerr;
  local_140.is_working._M_base._M_i = (__atomic_base<bool>)true;
  local_140.stream = (ostream *)&std::cerr;
  local_170 = (undefined1 *)&local_1c8;
  local_140.acceptor = &local_160.super_IAcceptor<Client>;
  ThreadPool<std::packaged_task<void_()>_>::ThreadPool(&local_140.thread_pool,2,10);
  Server<Client>::start(&local_140);
  ThreadPool<std::packaged_task<void_()>_>::~ThreadPool(&local_140.thread_pool);
  local_1c8 = &PTR_handle_0010c978;
  std::filesystem::__cxx11::path::~path(&local_1c0);
  return 0;
}

Assistant:

int main() {
    Server<Client>::Config config(
        THREADS_NUMBER, 
        QUEUE_SIZE,
        PORT
    );

    Acceptor<Client> acceptor(PORT);

    HTTPHandler<Client> http_handler(RESOLVE_PATH, std::cerr);
    ExceptionHandler<Client> exception_handler(http_handler, std::cerr);
    LoggingHandler<Client> logging_handler(exception_handler, std::cerr);

    Server<Client> server(logging_handler, acceptor, config, std::cerr);

    server.start();
}